

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex_nodes.h
# Opt level: O2

int __thiscall
alex::
AlexDataNode<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::
insert_using_shifts(AlexDataNode<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>
                    *this,double *key,double payload,int pos)

{
  int pos_00;
  double *pdVar1;
  double *pdVar2;
  uint pos_01;
  long lVar3;
  int iVar4;
  
  pos_01 = closest_gap(this,pos);
  set_bit(this,pos_01);
  iVar4 = pos_01 - pos;
  if ((int)pos_01 < pos) {
    pdVar1 = this->key_slots_;
    pdVar2 = this->payload_slots_;
    pos_00 = pos + -1;
    for (lVar3 = (long)(int)pos_01; lVar3 < pos_00; lVar3 = lVar3 + 1) {
      pdVar1[lVar3] = pdVar1[lVar3 + 1];
      pdVar2[lVar3] = pdVar2[lVar3 + 1];
    }
    insert_element_at(this,key,payload,pos_00);
    iVar4 = ~pos_01 + pos;
    pos = pos_00;
  }
  else {
    pdVar1 = this->key_slots_;
    pdVar2 = this->payload_slots_;
    for (lVar3 = (long)(int)pos_01; pos < lVar3; lVar3 = lVar3 + -1) {
      pdVar1[lVar3] = pdVar1[lVar3 + -1];
      pdVar2[lVar3] = pdVar2[lVar3 + -1];
    }
    insert_element_at(this,key,payload,pos);
  }
  this->num_shifts_ = this->num_shifts_ + (long)iVar4;
  return pos;
}

Assistant:

int insert_using_shifts(const T& key, P payload, int pos) {
    // Find the closest gap
    int gap_pos = closest_gap(pos);
    set_bit(gap_pos);
    if (gap_pos >= pos) {
      for (int i = gap_pos; i > pos; i--) {
#if ALEX_DATA_NODE_SEP_ARRAYS
        key_slots_[i] = key_slots_[i - 1];
        payload_slots_[i] = payload_slots_[i - 1];
#else
        data_slots_[i] = data_slots_[i - 1];
#endif
      }
      insert_element_at(key, payload, pos);
      num_shifts_ += gap_pos - pos;
      return pos;
    } else {
      for (int i = gap_pos; i < pos - 1; i++) {
#if ALEX_DATA_NODE_SEP_ARRAYS
        key_slots_[i] = key_slots_[i + 1];
        payload_slots_[i] = payload_slots_[i + 1];
#else
        data_slots_[i] = data_slots_[i + 1];
#endif
      }
      insert_element_at(key, payload, pos - 1);
      num_shifts_ += pos - gap_pos - 1;
      return pos - 1;
    }
  }